

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

Float __thiscall pbrt::Triangle::PDF(Triangle *this,ShapeSampleContext *ctx,Vector3f wi)

{
  Normal3f *n;
  Vector3<float> *v;
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  long lVar4;
  ShapeIntersection *pSVar5;
  long lVar6;
  long lVar7;
  Point3<float> *p2;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  Float FVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  float fVar29;
  undefined1 auVar30 [32];
  Point3f PVar31;
  Vector3<float> VVar32;
  initializer_list<pbrt::Point3<float>_> v_00;
  initializer_list<float> v_01;
  span<const_float> w;
  Vector3f local_248;
  float local_23c;
  undefined1 local_238 [16];
  Tuple3<pbrt::Vector3,_float> local_228;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  Tuple3<pbrt::Point3,_float> local_1f8;
  undefined4 local_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  Ray ray;
  Tuple3<pbrt::Point3,_float> local_148;
  optional<pbrt::ShapeIntersection> isect;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [56];
  
  local_248.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._8_56_ = wi._8_56_;
  auVar15._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_248.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar15._0_16_);
  PVar31 = ShapeSampleContext::p(ctx);
  isect.optionalValue._8_4_ = PVar31.super_Tuple3<pbrt::Point3,_float>.z;
  auVar16._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar16._8_56_ = auVar15._8_56_;
  isect.optionalValue.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar16._0_16_);
  FVar11 = SolidAngle(this,(Point3f *)&isect);
  if ((FVar11 < 0.0002) || (6.22 < FVar11)) {
    ShapeSampleContext::SpawnRay(&ray,ctx,&local_248);
    Intersect(&isect,this,&ray,INFINITY);
    auVar10 = ZEXT816(0) << 0x40;
    if (isect.set == true) {
      local_238._0_4_ = Area(this);
      pSVar5 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
      auVar13._0_8_ = local_248.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
      auVar13._8_4_ = 0x80000000;
      auVar13._12_4_ = 0x80000000;
      local_1f8.z = -local_248.super_Tuple3<pbrt::Vector3,_float>.z;
      local_1f8._0_8_ = vmovlps_avx(auVar13);
      local_218._0_4_ =
           AbsDot<float>(&(pSVar5->intr).super_Interaction.n,(Vector3<float> *)&local_1f8);
      auVar15._8_56_ = extraout_var_04;
      PVar31 = ShapeSampleContext::p(ctx);
      local_228.z = PVar31.super_Tuple3<pbrt::Point3,_float>.z;
      auVar27._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar27._8_56_ = auVar15._8_56_;
      local_228._0_8_ = vmovlps_avx(auVar27._0_16_);
      pSVar5 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
      PVar31 = Interaction::p((Interaction *)pSVar5);
      local_148.z = PVar31.super_Tuple3<pbrt::Point3,_float>.z;
      auVar28._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar28._8_56_ = auVar15._8_56_;
      local_148._0_8_ = vmovlps_avx(auVar28._0_16_);
      fVar12 = DistanceSquared<float>((pbrt *)&local_228,(Point3<float> *)&local_148,p2);
      fVar12 = (1.0 / (float)local_238._0_4_) / ((float)local_218._0_4_ / fVar12);
      auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar10._0_4_ = (uint)(ABS(fVar12) != INFINITY) * (int)fVar12;
    }
    local_238 = auVar10;
    pstd::optional<pbrt::ShapeIntersection>::~optional(&isect);
  }
  else {
    local_238._0_4_ = 1.0 / FVar11;
    if (((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
         (fVar12 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y, fVar12 != 0.0)) || (NAN(fVar12)))
       || ((fVar12 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z, fVar12 != 0.0 || (NAN(fVar12)))
          )) {
      n = &ctx->ns;
      lVar4 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
      lVar7 = *(long *)(lVar4 + 8);
      lVar6 = (long)this->triIndex * 0xc;
      lVar4 = *(long *)(lVar4 + 0x10);
      lVar8 = (long)*(int *)(lVar7 + lVar6) * 0xc;
      local_1e8._8_8_ = 0;
      local_1e8._0_8_ = *(ulong *)(lVar4 + 4 + lVar8);
      lVar9 = (long)*(int *)(lVar7 + 4 + lVar6) * 0xc;
      lVar7 = (long)*(int *)(lVar7 + 8 + lVar6) * 0xc;
      local_1d8 = vmovshdup_avx(local_1e8);
      uVar1 = *(ulong *)(lVar4 + 4 + lVar9);
      local_1c8._8_8_ = 0;
      local_1c8._0_8_ = uVar1;
      uVar2 = *(ulong *)(lVar4 + lVar7);
      local_198._8_8_ = 0;
      local_198._0_8_ = uVar2;
      local_23c = *(float *)(lVar4 + 8 + lVar7);
      local_208 = ZEXT416(*(uint *)(lVar4 + lVar8));
      local_1b8 = ZEXT416(*(uint *)(lVar4 + lVar9));
      auVar10 = vpermi2ps_avx512vl(_DAT_00538260,local_1e8,local_208);
      local_1a8 = vmovshdup_avx(local_1c8);
      auVar10 = vinsertps_avx(auVar10,local_1b8,0x30);
      auVar30._16_8_ = uVar1;
      auVar30._0_16_ = auVar10;
      auVar30._24_8_ = 0;
      auVar14._16_8_ = uVar2;
      auVar14._0_16_ = auVar10;
      auVar14._24_8_ = 0;
      ray._0_32_ = vshufpd_avx(auVar30,auVar14,2);
      auVar15._8_56_ = ZEXT856(ray._8_8_);
      v_00._M_len = 3;
      v_00._M_array = &ray.o;
      local_238 = ZEXT416((uint)local_238._0_4_);
      ray.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits._0_4_ = local_23c;
      pstd::array<pbrt::Point3<float>,_3>::array((array<pbrt::Point3<float>,_3> *)&isect,v_00);
      PVar31 = ShapeSampleContext::p(ctx);
      local_1f8.z = PVar31.super_Tuple3<pbrt::Point3,_float>.z;
      auVar17._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar17._8_56_ = auVar15._8_56_;
      local_1f8._0_8_ = vmovlpd_avx(auVar17._0_16_);
      auVar18._0_8_ =
           InvertSphericalTriangleSample
                     ((array<pbrt::Point3<float>,_3> *)&isect,(Point3f *)&local_1f8,&local_248);
      auVar18._8_56_ = extraout_var_03;
      local_188 = auVar18._0_16_;
      auVar15._8_56_ = extraout_var_03;
      PVar31 = ShapeSampleContext::p(ctx);
      fVar29 = PVar31.super_Tuple3<pbrt::Point3,_float>.z;
      auVar19._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar19._8_56_ = auVar15._8_56_;
      local_218 = auVar19._0_16_;
      fVar12 = (float)local_208._0_4_ - PVar31.super_Tuple3<pbrt::Point3,_float>.x;
      local_208 = vmovshdup_avx(local_218);
      auVar10 = vinsertps_avx(ZEXT416((uint)fVar12),
                              ZEXT416((uint)((float)local_1e8._0_4_ - local_208._0_4_)),0x10);
      auVar15._8_56_ = ZEXT856(auVar10._8_8_);
      uVar3 = vmovlps_avx(auVar10);
      ray.o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_1d8._0_4_ - fVar29;
      ray.o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
      ray.o.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
      VVar32 = Normalize<float>((Vector3<float> *)&ray);
      isect.optionalValue._8_4_ = VVar32.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar20._0_8_ = VVar32.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar15._8_56_;
      isect.optionalValue.__align =
           (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar20._0_16_);
      v = (Vector3<float> *)((long)&isect.optionalValue + 0xc);
      auVar10 = vinsertps_avx(ZEXT416((uint)((float)local_1b8._0_4_ - (float)local_218._0_4_)),
                              ZEXT416((uint)((float)local_1c8._0_4_ - (float)local_208._0_4_)),0x10)
      ;
      auVar15._8_56_ = ZEXT856(auVar10._8_8_);
      local_1f8.z = (float)local_1a8._0_4_ - fVar29;
      local_1f8._0_8_ = vmovlps_avx(auVar10);
      VVar32 = Normalize<float>((Vector3<float> *)&local_1f8);
      isect.optionalValue._20_4_ = VVar32.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar21._0_8_ = VVar32.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar21._8_56_ = auVar15._8_56_;
      isect.optionalValue._12_8_ = vmovlps_avx(auVar21._0_16_);
      auVar10 = vsubps_avx(local_198,local_218);
      auVar15._8_56_ = ZEXT856(auVar10._8_8_);
      local_228.z = local_23c - fVar29;
      local_228._0_8_ = vmovlps_avx(auVar10);
      VVar32 = Normalize<float>((Vector3<float> *)&local_228);
      isect.optionalValue._32_4_ = VVar32.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar22._0_8_ = VVar32.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar22._8_56_ = auVar15._8_56_;
      isect.optionalValue._24_8_ = vmovlps_avx(auVar22._0_16_);
      auVar23._0_4_ = AbsDot<float>(n,v);
      auVar23._4_60_ = extraout_var;
      auVar10 = vmaxss_avx(auVar23._0_16_,ZEXT416(0x3c23d70a));
      local_1f8.x = auVar10._0_4_;
      auVar24._0_4_ = AbsDot<float>(n,v);
      auVar24._4_60_ = extraout_var_00;
      auVar10 = vmaxss_avx(auVar24._0_16_,ZEXT416(0x3c23d70a));
      local_1f8.y = auVar10._0_4_;
      auVar25._0_4_ = AbsDot<float>(n,(Vector3<float> *)&isect);
      auVar25._4_60_ = extraout_var_01;
      auVar10 = vmaxss_avx(auVar25._0_16_,ZEXT416(0x3c23d70a));
      local_1f8.z = auVar10._0_4_;
      auVar26._0_4_ = AbsDot<float>(n,(Vector3<float> *)((long)&isect.optionalValue + 0x18));
      auVar26._4_60_ = extraout_var_02;
      auVar10 = vmaxss_avx(auVar26._0_16_,ZEXT416(0x3c23d70a));
      local_1ec = auVar10._0_4_;
      v_01._M_len = 4;
      v_01._M_array = &local_1f8.x;
      pstd::array<float,_4>::array((array<float,_4> *)&ray,v_01);
      w.n = 4;
      w.ptr = (float *)&ray;
      FVar11 = BilinearPDF((Point2f)local_188._0_8_,w);
      local_238._0_4_ = (float)local_238._0_4_ * FVar11;
    }
  }
  return (Float)local_238._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, Vector3f wi) const {
        Float solidAngle = SolidAngle(ctx.p());
        // Return PDF based on uniform area sampling for challenging triangles
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Intersect sample ray with shape geometry
            Ray ray = ctx.SpawnRay(wi);
            pstd::optional<ShapeIntersection> isect = Intersect(ray);
            if (!isect)
                return 0;

            // Compute PDF in solid angle measure from shape intersection point
            Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
            if (IsInf(pdf))
                pdf = 0;

            return pdf;
        }

        Float pdf = 1 / solidAngle;
        // Adjust PDF for warp product sampling of triangle $\cos \theta$ factor
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Get triangle vertices in _p0_, _p1_, and _p2_
            const TriangleMesh *mesh = GetMesh();
            const int *v = &mesh->vertexIndices[3 * triIndex];
            Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

            Point2f u = InvertSphericalTriangleSample({p0, p1, p2}, ctx.p(), wi);
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            pdf *= BilinearPDF(u, w);
        }

        return pdf;
    }